

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

void ihevcd_bits_seek(bitstrm_t *ps_bitstrm,WORD32 numbits)

{
  uint uVar1;
  uint *puVar2;
  int in_ESI;
  long in_RDI;
  UWORD32 temp;
  UWORD32 abs_numbits;
  WORD32 val;
  
  if (in_ESI < -0x20) {
    __assert_fail("(numbits >= -32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_bitstream.c"
                  ,0xe6,"void ihevcd_bits_seek(bitstrm_t *, WORD32)");
  }
  if (0x20 < in_ESI) {
    __assert_fail("(numbits <= 32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_bitstream.c"
                  ,0xe7,"void ihevcd_bits_seek(bitstrm_t *, WORD32)");
  }
  if (in_ESI < 0) {
    if (*(uint *)(in_RDI + 8) < (uint)-in_ESI) {
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + in_ESI;
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 0x20;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -4;
      uVar1 = *(uint *)(*(long *)(in_RDI + 0x10) + -8);
      *(undefined4 *)(in_RDI + 0x1c) = *(undefined4 *)(in_RDI + 0x18);
      *(uint *)(in_RDI + 0x18) =
           uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (int)(uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
    }
    else {
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + in_ESI;
    }
  }
  else {
    *(int *)(in_RDI + 8) = in_ESI + *(int *)(in_RDI + 8);
    if (0x1f < *(uint *)(in_RDI + 8)) {
      *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x1c);
      puVar2 = *(uint **)(in_RDI + 0x10);
      *(uint **)(in_RDI + 0x10) = puVar2 + 1;
      uVar1 = *puVar2;
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -0x20;
      *(uint *)(in_RDI + 0x1c) =
           uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
    }
  }
  return;
}

Assistant:

void ihevcd_bits_seek(bitstrm_t *ps_bitstrm, WORD32 numbits)
{
    WORD32 val;
    ASSERT(numbits >= -32);
    ASSERT(numbits <= 32);
    /* Check if Seeking backwards*/
    if(numbits < 0)
    {
        UWORD32 abs_numbits = -numbits;
        if(ps_bitstrm->u4_bit_ofst >= abs_numbits)
        {
            /* If the current offset is greater than number of bits to seek back,
             * then subtract abs_numbits from offset and return.
             */
            ps_bitstrm->u4_bit_ofst -= abs_numbits;
            return;
        }
        else
        {
            /* If the current offset is lesser than number of bits to seek back,
             * then subtract abs_numbits from offset and add 32 and move cur_word to nxt_word
             * and load cur_word appropriately and decrement pu4_buf
             */
            ps_bitstrm->u4_bit_ofst -= abs_numbits;
            ps_bitstrm->u4_bit_ofst += 32;
            ps_bitstrm->pu4_buf--;

            val = *(ps_bitstrm->pu4_buf - 2);
            ps_bitstrm->u4_nxt_word = ps_bitstrm->u4_cur_word;
            ps_bitstrm->u4_cur_word = ITT_BIG_ENDIAN(val);
            return;
        }
    }
    else
    {
        /* Not supported/tested currently */
        ASSERT(1);
        BITS_FLUSH(ps_bitstrm->pu4_buf,
                   ps_bitstrm->u4_bit_ofst,
                   ps_bitstrm->u4_cur_word,
                   ps_bitstrm->u4_nxt_word,
                   numbits);


    }
    return;
}